

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.c
# Opt level: O0

void TestSuite_StringSymbol(void)

{
  bool bVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  size_t sVar4;
  sysbvm_tuple_t sVar5;
  char *pcVar6;
  sysbvm_tuple_t secondSymbol_1;
  sysbvm_tuple_t symbol_1;
  int InternWithCString_isRunning;
  sysbvm_tuple_t secondSymbol;
  sysbvm_tuple_t symbol;
  int InternWithString_isRunning;
  
  sysbvm_test_currentTestCaseName = "InternWithString";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- InternWithString...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar3 = sysbvm_symbol_internWithString(sysbvm_test_context,2,"ABC");
    _Var2 = sysbvm_tuple_isBytes(sVar3);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:27: Assertion failure: sysbvm_tuple_isBytes(symbol)\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar4 = sysbvm_tuple_getSizeInBytes(sVar3);
    if (sVar4 != 2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:28: Obtained value is not equal to 2\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar5 = sysbvm_symbol_internWithString(sysbvm_test_context,2,"ABC");
    _Var2 = sysbvm_tuple_isBytes(sVar5);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:31: Assertion failure: sysbvm_tuple_isBytes(secondSymbol)\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar4 = sysbvm_tuple_getSizeInBytes(sVar5);
    if (sVar4 != 2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:32: Obtained value is not equal to 2\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    if (sVar3 != sVar5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:34: Obtained value is not equal to symbol\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar6 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar6 = "";
    }
    printf(pcVar6);
  }
  sysbvm_test_currentTestCaseName = "InternWithCString";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- InternWithCString...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar3 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Hello World\n");
    _Var2 = sysbvm_tuple_isBytes(sVar3);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:40: Assertion failure: sysbvm_tuple_isBytes(symbol)\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar4 = sysbvm_tuple_getSizeInBytes(sVar3);
    if (sVar4 != 0xc) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:41: Obtained value is not equal to 12\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar5 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Hello World\n");
    _Var2 = sysbvm_tuple_isBytes(sVar5);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:44: Assertion failure: sysbvm_tuple_isBytes(secondSymbol)\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar4 = sysbvm_tuple_getSizeInBytes(sVar5);
    if (sVar4 != 0xc) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:45: Obtained value is not equal to 12\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    if (sVar3 != sVar5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/String.c:47: Obtained value is not equal to symbol\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar6 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar6 = "";
    }
    printf(pcVar6);
  }
  return;
}

Assistant:

TEST_SUITE(StringSymbol)
{
    TEST_CASE_WITH_FIXTURE(InternWithString, TuuvmCore)
    {
        sysbvm_tuple_t symbol = sysbvm_symbol_internWithString(sysbvm_test_context, 2, "ABC");
        TEST_ASSERT(sysbvm_tuple_isBytes(symbol));
        TEST_ASSERT_EQUALS(2, sysbvm_tuple_getSizeInBytes(symbol));

        sysbvm_tuple_t secondSymbol = sysbvm_symbol_internWithString(sysbvm_test_context, 2, "ABC");
        TEST_ASSERT(sysbvm_tuple_isBytes(secondSymbol));
        TEST_ASSERT_EQUALS(2, sysbvm_tuple_getSizeInBytes(secondSymbol));

        TEST_ASSERT_EQUALS(symbol, secondSymbol);
    }

    TEST_CASE_WITH_FIXTURE(InternWithCString, TuuvmCore)
    {
        sysbvm_tuple_t symbol = sysbvm_symbol_internWithCString(sysbvm_test_context, "Hello World\n");
        TEST_ASSERT(sysbvm_tuple_isBytes(symbol));
        TEST_ASSERT_EQUALS(12, sysbvm_tuple_getSizeInBytes(symbol));

        sysbvm_tuple_t secondSymbol = sysbvm_symbol_internWithCString(sysbvm_test_context, "Hello World\n");
        TEST_ASSERT(sysbvm_tuple_isBytes(secondSymbol));
        TEST_ASSERT_EQUALS(12, sysbvm_tuple_getSizeInBytes(secondSymbol));

        TEST_ASSERT_EQUALS(symbol, secondSymbol);
    }
}